

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRProjectionNode.cpp
# Opt level: O3

void __thiscall
MinVR::VRProjectionNode::VRProjectionNode
          (VRProjectionNode *this,string *name,float fovX,float fovY,float nearClip,float farClip)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  float fVar3;
  VRMatrix4 projMat;
  undefined1 local_88 [8];
  _List_node_base *local_80;
  undefined1 local_78 [8];
  _List_node_base *p_Stack_70;
  string local_40;
  
  VRDisplayNode::VRDisplayNode(&this->super_VRDisplayNode,name);
  (this->super_VRDisplayNode)._vptr_VRDisplayNode = (_func_int **)&PTR__VRProjectionNode_00177860;
  this->_fovX = fovX;
  this->_fovY = fovY;
  this->_nearClip = nearClip;
  this->_farClip = farClip;
  VRMatrix4::VRMatrix4(&this->_projectionMatrix);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CameraMatrix","");
  VRDisplayNode::_addValueNeeded(&this->super_VRDisplayNode,&local_40,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_88 = (undefined1  [8])local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"ViewMatrix","");
  p_Var2 = (_List_node_base *)operator_new(0x30);
  p_Var2[1]._M_next = p_Var2 + 2;
  if (local_88 == (undefined1  [8])local_78) {
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_78._1_7_,local_78[0]);
    p_Var2[2]._M_prev = p_Stack_70;
  }
  else {
    p_Var2[1]._M_next = (_List_node_base *)local_88;
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_78._1_7_,local_78[0]);
  }
  p_Var2[1]._M_prev = local_80;
  local_80 = (_List_node_base *)0x0;
  local_78[0] = 0;
  local_88 = (undefined1  [8])local_78;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_88 != (undefined1  [8])local_78) {
    operator_delete((void *)local_88,CONCAT71(local_78._1_7_,local_78[0]) + 1);
  }
  local_88 = (undefined1  [8])local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"ProjectionMatrix","");
  p_Var2 = (_List_node_base *)operator_new(0x30);
  p_Var2[1]._M_next = p_Var2 + 2;
  if (local_88 == (undefined1  [8])local_78) {
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_78._1_7_,local_78[0]);
    p_Var2[2]._M_prev = p_Stack_70;
  }
  else {
    p_Var2[1]._M_next = (_List_node_base *)local_88;
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_78._1_7_,local_78[0]);
  }
  p_Var2[1]._M_prev = local_80;
  local_80 = (_List_node_base *)0x0;
  local_78[0] = 0;
  local_88 = (undefined1  [8])local_78;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_88 != (undefined1  [8])local_78) {
    operator_delete((void *)local_88,CONCAT71(local_78._1_7_,local_78[0]) + 1);
  }
  fVar3 = tanf(fovX * 0.017453292 * 0.5);
  this->_horizontalClip = fVar3 * this->_nearClip;
  fVar3 = tanf(fovY * 0.017453292 * 0.5);
  fVar3 = fVar3 * this->_nearClip;
  this->_verticalClip = fVar3;
  VRMatrix4::projection
            ((VRMatrix4 *)local_88,-this->_horizontalClip,this->_horizontalClip,-fVar3,fVar3,
             this->_nearClip,this->_farClip);
  VRMatrix4::operator=(&this->_projectionMatrix,(VRMatrix4 *)local_88);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_88);
  return;
}

Assistant:

VRProjectionNode::VRProjectionNode(const std::string &name, float fovX, float fovY, float nearClip, float farClip):
  VRDisplayNode(name), _fovX(fovX), _fovY(fovY), _nearClip(nearClip), _farClip(farClip)
{
  // in:
  _addValueNeeded("CameraMatrix");
  // These should be recorded as necessary, and the auditValues()
  // method needs to be changed to accommodate not just the values
  // added by nodes in teh display tree, but also from the config
  // files.
  //_addValueNeeded("NearClip");
  // _addValueNeeded("FarClip");
  // _addValueNeeded("FieldOfViewY");
  // _addValueNeeded("FieldOfViewX");

  // out:
  _valuesAdded.push_back("ViewMatrix");
  _valuesAdded.push_back("ProjectionMatrix");

  float degreeToRadian = 3.1415926f / 180;
  _horizontalClip = tan(fovX * degreeToRadian / 2.0f) * _nearClip;
  _verticalClip = tan(fovY * degreeToRadian / 2.0f) * _nearClip;

  VRMatrix4 projMat = VRMatrix4::projection(-_horizontalClip, _horizontalClip, -_verticalClip, _verticalClip, _nearClip, _farClip); //TODO: This should just be cacheable once since it doesn't change.
 _projectionMatrix = projMat;


}